

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QRect> * __thiscall QList<QRect>::fill(QList<QRect> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QRect> *pQVar3;
  QRect *b;
  QRect *this_00;
  longlong *plVar4;
  DataOps *n;
  parameter_type in_RDX;
  __off_t __length;
  parameter_type in_RSI;
  QArrayDataPointer<QRect> *in_RDI;
  long in_FS_OFFSET;
  QRect copy;
  DataPointer detached;
  QArrayDataPointer<QRect> *in_stack_ffffffffffffff68;
  parameter_type pQVar5;
  QArrayDataPointer<QRect> *in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QRect> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QArrayDataPointer<QRect> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  undefined8 local_38;
  undefined8 local_30;
  QArrayDataPointer<QRect> local_28;
  parameter_type local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (parameter_type)0xffffffffffffffff) {
    local_10 = (parameter_type)size((QList<QRect> *)in_RDI);
  }
  QArrayDataPointer<QRect>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QRect>::needsDetach(in_stack_ffffffffffffff70);
  pQVar5 = local_10;
  if ((bVar1) || (qVar2 = capacity((QList<QRect> *)0x6506a2), qVar2 < (long)pQVar5)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QRect>::operator->(in_RDI);
    QArrayDataPointer<QRect>::detachCapacity(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QArrayDataPointer<QRect>::QArrayDataPointer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,
               (AllocationOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QRect>::operator->(&local_28);
    QtPrivate::QGenericArrayOps<QRect>::copyAppend
              ((QGenericArrayOps<QRect> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (parameter_type)in_stack_ffffffffffffff70);
    QArrayDataPointer<QRect>::swap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<QRect>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    local_38._0_4_ = in_RSI->x1;
    local_38._4_4_ = in_RSI->y1;
    local_30._0_4_ = in_RSI->x2;
    local_30._4_4_ = in_RSI->y2;
    pQVar3 = (QGenericArrayOps<QRect> *)QArrayDataPointer<QRect>::operator->(in_RDI);
    b = QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x65078e);
    this_00 = QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x65079d);
    local_40 = size((QList<QRect> *)in_RDI);
    plVar4 = qMin<long_long>(&local_40,(longlong *)&local_10);
    QtPrivate::QGenericArrayOps<QRect>::assign(pQVar3,b,this_00 + *plVar4,in_RSI);
    pQVar5 = local_10;
    qVar2 = size((QList<QRect> *)in_RDI);
    if (qVar2 < (long)pQVar5) {
      n = QArrayDataPointer<QRect>::operator->(in_RDI);
      pQVar5 = local_10;
      size((QList<QRect> *)in_RDI);
      QtPrivate::QGenericArrayOps<QRect>::copyAppend
                ((QGenericArrayOps<QRect> *)this_00,(qsizetype)n,pQVar5);
    }
    else {
      pQVar5 = local_10;
      qVar2 = size((QList<QRect> *)in_RDI);
      if ((long)pQVar5 < qVar2) {
        pQVar3 = (QGenericArrayOps<QRect> *)QArrayDataPointer<QRect>::operator->(in_RDI);
        QtPrivate::QGenericArrayOps<QRect>::truncate(pQVar3,(char *)local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QRect> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}